

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-time.c
# Opt level: O1

int run_test_loop_update_time(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  undefined1 auStack_b8 [152];
  code *pcStack_20;
  
  pcStack_20 = (code *)0x163f26;
  uVar2 = uv_default_loop();
  pcStack_20 = (code *)0x163f2e;
  lVar3 = uv_now(uVar2);
  do {
    pcStack_20 = (code *)0x163f36;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x163f3e;
    lVar4 = uv_now(uVar2);
    pcStack_20 = (code *)0x163f49;
    uVar2 = uv_default_loop();
    if (999 < (ulong)(lVar4 - lVar3)) goto LAB_00163f6b;
    pcStack_20 = (code *)0x163f62;
    iVar1 = uv_run(uVar2,2);
  } while (iVar1 == 0);
  pcStack_20 = (code *)0x163f6b;
  run_test_loop_update_time_cold_2();
LAB_00163f6b:
  pcStack_20 = (code *)0x163f7c;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_20 = (code *)0x163f86;
  uv_run(uVar2,0);
  pcStack_20 = (code *)0x163f8b;
  uVar2 = uv_default_loop();
  pcStack_20 = (code *)0x163f93;
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_20 = run_test_loop_backend_timeout;
  run_test_loop_update_time_cold_1();
  pcStack_20 = (code *)lVar3;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_b8);
  if (iVar1 == 0) {
    iVar1 = uv_loop_alive(uVar2);
    if (iVar1 != 0) goto LAB_00164083;
    iVar1 = uv_backend_timeout(uVar2);
    if (iVar1 != 0) goto LAB_00164088;
    iVar1 = uv_timer_start(auStack_b8,cb,1000,0);
    if (iVar1 != 0) goto LAB_0016408d;
    iVar1 = uv_backend_timeout(uVar2);
    if (iVar1 < 0x65) goto LAB_00164092;
    iVar1 = uv_backend_timeout(uVar2);
    if (1000 < iVar1) goto LAB_00164097;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0016409c;
    iVar1 = uv_backend_timeout(uVar2);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001640a6;
    }
  }
  else {
    run_test_loop_backend_timeout_cold_1();
LAB_00164083:
    run_test_loop_backend_timeout_cold_2();
LAB_00164088:
    run_test_loop_backend_timeout_cold_3();
LAB_0016408d:
    run_test_loop_backend_timeout_cold_4();
LAB_00164092:
    run_test_loop_backend_timeout_cold_5();
LAB_00164097:
    run_test_loop_backend_timeout_cold_6();
LAB_0016409c:
    run_test_loop_backend_timeout_cold_7();
  }
  run_test_loop_backend_timeout_cold_8();
LAB_001640a6:
  run_test_loop_backend_timeout_cold_9();
  iVar1 = uv_close();
  return iVar1;
}

Assistant:

TEST_IMPL(loop_update_time) {
  uint64_t start;

  start = uv_now(uv_default_loop());
  while (uv_now(uv_default_loop()) - start < 1000)
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}